

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O3

int __thiscall
ncnn::CopyTo::forward
          (CopyTo *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  Mat *pMVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  undefined4 in_EAX;
  int iVar12;
  int *piVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  void *in_R8;
  size_t sVar19;
  pointer pMVar20;
  long lVar21;
  void *pvVar22;
  size_t sVar23;
  void *pvVar24;
  undefined1 auVar25 [16];
  int _woffset;
  int _hoffset;
  int _coffset;
  int _doffset;
  int local_10c;
  Mat *local_108;
  int local_fc;
  long local_f8;
  size_t local_f0;
  long local_e8;
  long local_e0;
  Mat local_d8;
  long local_88;
  long local_80;
  int local_74;
  long local_70;
  ulong local_68;
  pointer local_60;
  int local_54;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pMVar20 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = pMVar20->dims;
  local_f0 = pMVar20->elemsize;
  if (pMVar20[1].dims == uVar5) {
    uVar1 = pMVar20->w;
    uVar2 = pMVar20->h;
    uVar3 = pMVar20->d;
    uVar4 = pMVar20->c;
    auVar25._0_4_ = -(uint)(pMVar20[1].w == uVar1);
    auVar25._4_4_ = -(uint)(pMVar20[1].h == uVar2);
    auVar25._8_4_ = -(uint)(pMVar20[1].d == uVar3);
    auVar25._12_4_ = -(uint)(pMVar20[1].c == uVar4);
    iVar12 = movmskps(in_EAX,auVar25);
    if (iVar12 == 0xf) {
      if (pMVar7 != pMVar20 + 1) {
        piVar13 = pMVar20[1].refcount;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        piVar13 = pMVar7->refcount;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (pMVar7->allocator == (Allocator *)0x0) {
              if (pMVar7->data != (void *)0x0) {
                free(pMVar7->data);
              }
            }
            else {
              (*pMVar7->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar7->cstep = 0;
        pMVar7->data = (void *)0x0;
        pMVar7->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&pMVar7->refcount + 4) = (undefined1  [16])0x0;
        pMVar7->dims = 0;
        pMVar7->w = 0;
        pMVar7->h = 0;
        pMVar7->d = 0;
        pMVar7->c = 0;
        piVar13 = pMVar20[1].refcount;
        pMVar7->data = pMVar20[1].data;
        pMVar7->refcount = piVar13;
        pMVar7->elemsize = pMVar20[1].elemsize;
        pMVar7->elempack = pMVar20[1].elempack;
        pMVar7->allocator = pMVar20[1].allocator;
        iVar12 = pMVar20[1].w;
        iVar6 = pMVar20[1].h;
        iVar11 = pMVar20[1].d;
        pMVar7->dims = pMVar20[1].dims;
        pMVar7->w = iVar12;
        pMVar7->h = iVar6;
        pMVar7->d = iVar11;
        pMVar7->c = pMVar20[1].c;
        pMVar7->cstep = pMVar20[1].cstep;
        return 0;
      }
      return 0;
    }
  }
  Mat::clone(&local_d8,(__fn *)pMVar20,opt->blob_allocator,(int)opt,in_R8);
  piVar13 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (pMVar7 != &local_d8) {
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = pMVar7->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (pMVar7->allocator == (Allocator *)0x0) {
          if (pMVar7->data != (void *)0x0) {
            free(pMVar7->data);
          }
        }
        else {
          (*pMVar7->allocator->_vptr_Allocator[3])();
        }
      }
    }
    pMVar7->data = local_d8.data;
    piVar13 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    pMVar7->refcount = piVar13;
    pMVar7->elemsize = local_d8.elemsize;
    pMVar7->elempack = local_d8.elempack;
    pMVar7->allocator = local_d8.allocator;
    pMVar7->dims = local_d8.dims;
    pMVar7->w = local_d8.w;
    pMVar7->h = local_d8.h;
    pMVar7->d = local_d8.d;
    pMVar7->c = local_d8.c;
    pMVar7->cstep = local_d8.cstep;
  }
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (pMVar7->data == (void *)0x0) {
    return -100;
  }
  if ((long)pMVar7->c * pMVar7->cstep == 0) {
    return -100;
  }
  switch(pMVar20->dims) {
  case 1:
    local_d8.cstep = (long)pMVar20->elempack * (long)pMVar20->w;
    local_d8.elemsize = 4;
    local_d8.elempack = 1;
    local_d8.dims = 1;
    local_d8.w = (int)local_d8.cstep;
    local_d8.h = 1;
    local_d8.d = 1;
    local_d8.c = 1;
    break;
  case 2:
    local_d8.w = pMVar20->w;
    lVar15 = (long)pMVar20->elempack * (long)pMVar20->h;
    local_d8.elemsize = 4;
    local_d8.elempack = 1;
    local_d8.dims = 2;
    local_d8.h = (int)lVar15;
    local_d8.d = 1;
    local_d8.c = 1;
    local_d8.cstep = lVar15 * local_d8.w;
    break;
  case 3:
    local_d8.w = pMVar20->w;
    local_d8.h = pMVar20->h;
    local_d8.c = pMVar20->elempack * pMVar20->c;
    local_d8.dims = 3;
    local_d8.d = 1;
    lVar15 = (long)local_d8.h * (long)local_d8.w;
    goto LAB_005987a1;
  case 4:
    local_d8.w = pMVar20->w;
    local_d8.h = pMVar20->h;
    local_d8.d = pMVar20->d;
    local_d8.c = pMVar20->elempack * pMVar20->c;
    local_d8.dims = 4;
    lVar15 = (long)local_d8.h * (long)local_d8.w * (long)local_d8.d;
LAB_005987a1:
    local_d8.elempack = 1;
    local_d8.elemsize = 4;
    local_d8.cstep = lVar15 + 3U & 0x3ffffffffffffffc;
    break;
  default:
    local_d8.cstep = 0;
    local_d8.elemsize = 0;
    local_d8.elempack = 0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
  }
  local_d8.allocator = (Allocator *)0x0;
  local_d8.refcount._4_4_ = 0;
  local_d8.refcount._0_4_ = 0;
  local_d8.data = (void *)0x0;
  resolve_copyto_offset(this,&local_d8,&local_10c,&local_fc,&local_54,&local_74);
  piVar13 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_108 = pMVar7;
  local_60 = pMVar20;
  switch(uVar5) {
  case 1:
    if (local_f0 == 4) {
      iVar12 = pMVar20[1].h;
      if (iVar12 < 1) {
        return 0;
      }
      pvVar22 = (void *)((long)local_10c * 4 + (long)pMVar7->data);
      pvVar24 = pMVar20[1].data;
      sVar23 = (long)pMVar20[1].w * 4;
      do {
        memcpy(pvVar22,pvVar24,sVar23);
        pvVar22 = (void *)((long)pvVar22 + (long)local_108->w * 4);
        pvVar24 = (void *)((long)pvVar24 + sVar23);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      return 0;
    }
    if (local_f0 == 2) {
      iVar12 = pMVar20[1].h;
      if (iVar12 < 1) {
        return 0;
      }
      pvVar22 = (void *)((long)local_10c * 2 + (long)pMVar7->data);
      pvVar24 = pMVar20[1].data;
      sVar23 = (long)pMVar20[1].w * 2;
      do {
        memcpy(pvVar22,pvVar24,sVar23);
        pvVar22 = (void *)((long)pvVar22 + (long)local_108->w * 2);
        pvVar24 = (void *)((long)pvVar24 + sVar23);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      return 0;
    }
    if (local_f0 != 1) {
      return 0;
    }
    iVar12 = pMVar20[1].h;
    if (iVar12 < 1) {
      return 0;
    }
    pvVar24 = (void *)((long)local_10c + (long)pMVar7->data);
    pvVar22 = pMVar20[1].data;
    iVar6 = pMVar20[1].w;
    do {
      memcpy(pvVar24,pvVar22,(long)iVar6);
      pvVar22 = (void *)((long)pvVar22 + (long)iVar6);
      pvVar24 = (void *)((long)pvVar24 + (long)local_108->w);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
    return 0;
  case 2:
    if (local_f0 == 4) {
      iVar12 = pMVar20[1].h;
      if (iVar12 < 1) {
        return 0;
      }
      pvVar22 = (void *)((long)pMVar7->data +
                        (long)local_10c * 4 + (long)pMVar7->w * (long)local_fc * pMVar7->elemsize);
      pvVar24 = pMVar20[1].data;
      sVar23 = (long)pMVar20[1].w * 4;
      do {
        memcpy(pvVar22,pvVar24,sVar23);
        pvVar22 = (void *)((long)pvVar22 + (long)pMVar7->w * 4);
        pvVar24 = (void *)((long)pvVar24 + sVar23);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    else if (local_f0 == 2) {
      iVar12 = pMVar20[1].h;
      if (iVar12 < 1) {
        return 0;
      }
      pvVar22 = (void *)((long)pMVar7->data +
                        (long)local_10c * 2 + (long)pMVar7->w * (long)local_fc * pMVar7->elemsize);
      pvVar24 = pMVar20[1].data;
      sVar23 = (long)pMVar20[1].w * 2;
      do {
        memcpy(pvVar22,pvVar24,sVar23);
        pvVar22 = (void *)((long)pvVar22 + (long)pMVar7->w * 2);
        pvVar24 = (void *)((long)pvVar24 + sVar23);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    else {
      if (local_f0 != 1) {
        return 0;
      }
      iVar12 = pMVar20[1].h;
      if (iVar12 < 1) {
        return 0;
      }
      pvVar24 = (void *)((long)pMVar7->data +
                        (long)local_10c + (long)pMVar7->w * (long)local_fc * pMVar7->elemsize);
      pvVar22 = pMVar20[1].data;
      iVar6 = pMVar20[1].w;
      do {
        memcpy(pvVar24,pvVar22,(long)iVar6);
        pvVar22 = (void *)((long)pvVar22 + (long)iVar6);
        pvVar24 = (void *)((long)pvVar24 + (long)pMVar7->w);
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    if (uVar5 != 4) {
      if (uVar5 != 3) {
        return 0;
      }
      goto switchD_005988da_caseD_3;
    }
    break;
  case 3:
switchD_005988da_caseD_3:
    if (local_60[1].c < 1) {
      return 0;
    }
    local_e0 = (long)local_74;
    local_88 = (long)local_10c;
    local_f8 = (long)local_fc;
    local_70 = local_88 * 4;
    local_e8 = local_88 * 2;
    lVar15 = 0;
    local_80 = local_e0;
    local_68 = (ulong)uVar5;
    do {
      sVar23 = (size_t)local_60[1].w;
      iVar12 = local_60[1].h;
      pvVar22 = local_60[1].data;
      sVar19 = local_60[1].elemsize;
      sVar8 = local_60[1].cstep;
      lVar16 = (long)local_108->w;
      pvVar24 = local_108->data;
      sVar9 = local_108->elemsize;
      sVar10 = local_108->cstep;
      if (local_f0 == 4) {
        if (0 < iVar12) {
          pvVar24 = (void *)((long)pvVar24 +
                            sVar9 * (local_f8 * lVar16 + sVar10 * local_e0) + local_70);
          pvVar22 = (void *)((long)pvVar22 + sVar8 * sVar19 * lVar15);
          do {
            memcpy(pvVar24,pvVar22,sVar23 * 4);
            pvVar24 = (void *)((long)pvVar24 + lVar16 * 4);
            pvVar22 = (void *)((long)pvVar22 + sVar23 * 4);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
      }
      else if (local_f0 == 2) {
        if (0 < iVar12) {
          pvVar24 = (void *)((long)pvVar24 +
                            sVar9 * (local_f8 * lVar16 + sVar10 * local_e0) + local_e8);
          pvVar22 = (void *)((long)pvVar22 + sVar8 * sVar19 * lVar15);
          do {
            memcpy(pvVar24,pvVar22,sVar23 * 2);
            pvVar24 = (void *)((long)pvVar24 + lVar16 * 2);
            pvVar22 = (void *)((long)pvVar22 + sVar23 * 2);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
      }
      else if ((local_f0 == 1) && (0 < iVar12)) {
        pvVar22 = (void *)((long)pvVar22 + sVar8 * lVar15 * sVar19);
        pvVar24 = (void *)((long)pvVar24 +
                          sVar9 * lVar16 * local_f8 + local_88 +
                          sVar10 * (local_80 + lVar15) * sVar9);
        do {
          memcpy(pvVar24,pvVar22,sVar23);
          pvVar22 = (void *)((long)pvVar22 + sVar23);
          pvVar24 = (void *)((long)pvVar24 + lVar16);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      lVar15 = lVar15 + 1;
      local_e0 = local_e0 + 1;
    } while (lVar15 < local_60[1].c);
    if ((int)local_68 != 4) {
      return 0;
    }
    break;
  case 4:
    break;
  default:
    goto LAB_0059900c;
  }
  iVar12 = local_60[1].c;
  if (0 < iVar12) {
    local_88 = (long)local_74;
    local_70 = (long)local_54;
    local_38 = (long)local_10c;
    local_80 = (long)local_fc;
    uVar14 = (ulong)(uint)local_60[1].d;
    local_40 = local_38 * 4;
    local_48 = local_38 * 2;
    local_e8 = 0;
    sVar19 = local_f0;
    pMVar20 = local_60;
    local_50 = local_88;
    do {
      if (0 < (int)uVar14) {
        local_68 = local_50 + local_e8;
        local_f8 = local_70;
        local_e0 = 0;
        do {
          sVar23 = (size_t)pMVar20[1].w;
          iVar12 = pMVar20[1].h;
          pvVar22 = pMVar20[1].data;
          sVar8 = pMVar20[1].elemsize;
          lVar17 = pMVar20[1].cstep * local_e8;
          lVar18 = (long)iVar12;
          lVar21 = local_e0 * sVar23;
          lVar16 = (long)local_108->w;
          lVar15 = (long)local_108->h;
          pvVar24 = local_108->data;
          sVar9 = local_108->elemsize;
          sVar10 = local_108->cstep;
          if (sVar19 == 4) {
            if (0 < iVar12) {
              pvVar24 = (void *)((long)pvVar24 +
                                sVar9 * ((lVar15 * local_f8 + local_80) * lVar16 + sVar10 * local_88
                                        ) + local_40);
              pvVar22 = (void *)((long)pvVar22 + sVar8 * (lVar21 * lVar18 + lVar17));
              do {
                memcpy(pvVar24,pvVar22,sVar23 * 4);
                pvVar24 = (void *)((long)pvVar24 + lVar16 * 4);
                pvVar22 = (void *)((long)pvVar22 + sVar23 * 4);
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
          }
          else if (sVar19 == 2) {
            if (0 < iVar12) {
              pvVar24 = (void *)((long)pvVar24 +
                                sVar9 * ((lVar15 * local_f8 + local_80) * lVar16 + sVar10 * local_88
                                        ) + local_48);
              pvVar22 = (void *)((long)pvVar22 + sVar8 * (lVar21 * lVar18 + lVar17));
              do {
                memcpy(pvVar24,pvVar22,sVar23 * 2);
                pvVar24 = (void *)((long)pvVar24 + lVar16 * 2);
                pvVar22 = (void *)((long)pvVar22 + sVar23 * 2);
                iVar12 = iVar12 + -1;
              } while (iVar12 != 0);
            }
          }
          else if ((sVar19 == 1) && (0 < iVar12)) {
            pvVar22 = (void *)((long)pvVar22 + lVar21 * lVar18 * sVar8 + lVar17 * sVar8);
            pvVar24 = (void *)((long)pvVar24 +
                              sVar9 * lVar16 * local_80 + local_38 +
                              lVar15 * (local_70 + local_e0) * sVar9 * lVar16 +
                              sVar10 * local_68 * sVar9);
            do {
              memcpy(pvVar24,pvVar22,sVar23);
              pvVar22 = (void *)((long)pvVar22 + sVar23);
              pvVar24 = (void *)((long)pvVar24 + lVar16);
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          local_e0 = local_e0 + 1;
          uVar14 = (ulong)local_60[1].d;
          local_f8 = local_f8 + 1;
          sVar19 = local_f0;
          pMVar20 = local_60;
        } while (local_e0 < (long)uVar14);
        iVar12 = local_60[1].c;
      }
      local_e8 = local_e8 + 1;
      local_88 = local_88 + 1;
    } while (local_e8 < iVar12);
  }
LAB_0059900c:
  return 0;
}

Assistant:

int CopyTo::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& self_blob = bottom_blobs[0];
    const Mat& src_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = self_blob.w;
    int h = self_blob.h;
    int d = self_blob.d;
    int channels = self_blob.c;
    int dims = self_blob.dims;
    size_t elemsize = self_blob.elemsize;

    if (src_blob.dims == dims && src_blob.w == w && src_blob.h == h && src_blob.d == d && src_blob.c == channels)
    {
        top_blob = src_blob;
        return 0;
    }

    top_blob = self_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int _woffset, _hoffset, _doffset, _coffset;
    resolve_copyto_offset(self_blob.shape(), _woffset, _hoffset, _doffset, _coffset);

    if (dims == 1)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            const Mat roim = src_blob.channel(q);
            Mat m = top_blob.channel(q + _coffset);

            if (elemsize == 1)
                copy_to_image<signed char>(roim, m, _hoffset, _woffset);
            if (elemsize == 2)
                copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
            if (elemsize == 4)
                copy_to_image<float>(roim, m, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            for (int z = 0; z < src_blob.d; z++)
            {
                const Mat roim = src_blob.channel(q).depth(z);
                Mat m = top_blob.channel(q + _coffset).depth(z + _doffset);

                if (elemsize == 1)
                    copy_to_image<signed char>(roim, m, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_to_image<float>(roim, m, _hoffset, _woffset);
            }
        }
    }

    return 0;
}